

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_snapshot_sync.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::handle_install_snapshot_resp_new_member(raft_server *this,resp_msg *resp)

{
  uint uVar1;
  bool bVar2;
  type tVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  element_type *peVar7;
  uint *puVar8;
  element_type *peVar9;
  element_type *peVar10;
  raft_server *prVar11;
  element_type *peVar12;
  ulong uVar13;
  ulong uVar14;
  resp_msg *in_RSI;
  long in_RDI;
  ulong in_stack_00000178;
  raft_server *in_stack_00000180;
  bool snp_install_done;
  ptr<snapshot> snp;
  ptr<snapshot_sync_ctx> sync_ctx;
  memory_order __b;
  resp_msg *in_stack_fffffffffffffda8;
  peer *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  int in_stack_fffffffffffffe38;
  byte bVar15;
  undefined1 in_stack_fffffffffffffe3d;
  type in_stack_fffffffffffffe3e;
  undefined1 uVar16;
  raft_server *in_stack_fffffffffffffe40;
  string local_140 [32];
  string local_120 [32];
  string local_100 [39];
  byte local_d9;
  __shared_ptr local_d8 [23];
  byte local_c1;
  undefined4 local_ac;
  string local_a8 [48];
  string local_78 [48];
  string local_48 [32];
  resp_msg *local_28;
  uint local_14;
  memory_order local_10;
  int local_c;
  uint *local_8;
  
  local_28 = in_RSI;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3a0));
  if (!bVar2) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (!bVar2) {
      return;
    }
    peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b08cc);
    iVar4 = (**(code **)(*(long *)peVar7 + 0x38))();
    if (iVar4 < 4) {
      return;
    }
    peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b08f2);
    msg_if_given_abi_cxx11_((char *)local_48,"no server to join, the response must be very old.");
    (**(code **)(*(long *)peVar7 + 0x40))
              (peVar7,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
               ,"handle_install_snapshot_resp_new_member",0x195,local_48);
    std::__cxx11::string::~string(local_48);
    return;
  }
  bVar2 = resp_msg::get_accepted(local_28);
  if (!bVar2) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar2) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b09cc);
      iVar4 = (**(code **)(*(long *)peVar7 + 0x38))();
      if (2 < iVar4) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b09f2);
        uVar13 = resp_msg::get_next_idx(local_28);
        msg_if_given_abi_cxx11_
                  ((char *)local_78,
                   "peer doesn\'t accept the snapshot installation request, next log idx %lu, but we can move forward"
                   ,uVar13);
        (**(code **)(*(long *)peVar7 + 0x40))
                  (peVar7,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp_new_member",0x19d,local_78);
        std::__cxx11::string::~string(local_78);
      }
    }
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b0aa5);
    resp_msg::get_next_idx(local_28);
    peer::set_next_log_idx(in_stack_fffffffffffffdb0,(ulong)in_stack_fffffffffffffda8);
  }
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1b0ade
            );
  peer::reset_resp_timer((peer *)0x1b0ae6);
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1b0afa
            );
  peer::get_snapshot_sync_ctx((peer *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
  ;
  bVar2 = std::operator==((shared_ptr<nuraft::snapshot_sync_ctx> *)in_stack_fffffffffffffdb0,
                          in_stack_fffffffffffffda8);
  if (bVar2) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar2) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b0b55);
      iVar4 = (**(code **)(*(long *)peVar7 + 0x38))();
      if (0 < iVar4) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b0b8e);
        uVar5 = msg_base::get_src(&local_28->super_msg_base);
        uVar6 = msg_base::get_dst(&local_28->super_msg_base);
        uVar1 = *(uint *)(in_RDI + 0x38);
        puVar8 = (uint *)(in_RDI + 0x34);
        local_c = 5;
        local_8 = puVar8;
        local_10 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        if (local_c - 1U < 2) {
          local_14 = *puVar8;
        }
        else if (local_c == 5) {
          local_14 = *puVar8;
        }
        else {
          local_14 = *puVar8;
        }
        msg_if_given_abi_cxx11_
                  ((char *)local_a8,
                   "SnapshotSyncContext must not be null: src %d dst %d my id %d leader id %d, maybe leader election happened in the meantime. next heartbeat or append request will cover it up."
                   ,(ulong)uVar5,(ulong)uVar6,(ulong)uVar1,(ulong)local_14);
        (**(code **)(*(long *)peVar7 + 0x40))
                  (peVar7,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp_new_member",0x1a8,local_a8);
        std::__cxx11::string::~string(local_a8);
      }
    }
    local_ac = 1;
    goto LAB_001b1372;
  }
  peVar9 = std::
           __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b0d44);
  snapshot_sync_ctx::get_snapshot(peVar9);
  std::shared_ptr<nuraft::snapshot>::shared_ptr
            ((shared_ptr<nuraft::snapshot> *)in_stack_fffffffffffffdb0,
             (shared_ptr<nuraft::snapshot> *)in_stack_fffffffffffffda8);
  peVar10 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1b0d80);
  local_d9 = 0;
  tVar3 = snapshot::get_type(peVar10);
  if (tVar3 == raw_binary) {
    prVar11 = (raft_server *)resp_msg::get_next_idx(local_28);
    peVar10 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b0dcc);
    in_stack_fffffffffffffe40 = (raft_server *)snapshot::size(peVar10);
    bVar15 = true;
    if (prVar11 < in_stack_fffffffffffffe40) goto LAB_001b0dfc;
  }
  else {
LAB_001b0dfc:
    peVar10 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b0e09);
    in_stack_fffffffffffffe3e = snapshot::get_type(peVar10);
    in_stack_fffffffffffffe3d = false;
    bVar15 = in_stack_fffffffffffffe3d;
    if (in_stack_fffffffffffffe3e == logical_object) {
      resp_msg::get_ctx(in_stack_fffffffffffffda8);
      local_d9 = 1;
      in_stack_fffffffffffffe3d = std::__shared_ptr::operator_cast_to_bool(local_d8);
      bVar15 = in_stack_fffffffffffffe3d;
    }
  }
  uVar16 = bVar15;
  if ((local_d9 & 1) != 0) {
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x1b0e9a);
  }
  local_c1 = bVar15 & 1;
  if (local_c1 == 0) {
    std::__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b11fa);
    resp_msg::get_next_idx(local_28);
    snapshot_sync_ctx::set_offset
              ((snapshot_sync_ctx *)in_stack_fffffffffffffdb0,(ulong)in_stack_fffffffffffffda8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar2) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b1255);
      iVar4 = (**(code **)(*(long *)peVar7 + 0x38))();
      if (4 < iVar4) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b1288);
        uVar13 = resp_msg::get_next_idx(local_28);
        msg_if_given_abi_cxx11_
                  ((char *)local_140,"continue to send snapshot to new server at offset %lu",uVar13)
        ;
        (**(code **)(*(long *)peVar7 + 0x40))
                  (peVar7,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp_new_member",0x1c5,local_140);
        std::__cxx11::string::~string(local_140);
      }
    }
  }
  else {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar2) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b0ee9);
      in_stack_fffffffffffffe38 = (**(code **)(*(long *)peVar7 + 0x38))();
      if (3 < in_stack_fffffffffffffe38) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b0f22);
        msg_if_given_abi_cxx11_((char *)local_100,"snapshot install is done\n");
        (**(code **)(*(long *)peVar7 + 0x40))
                  (peVar7,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp_new_member",0x1b5,local_100);
        std::__cxx11::string::~string(local_100);
      }
    }
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b0fd8);
    peVar9 = std::
             __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b0fea);
    snapshot_sync_ctx::get_snapshot(peVar9);
    peVar10 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b1009);
    snapshot::get_last_log_idx(peVar10);
    peer::set_next_log_idx(in_stack_fffffffffffffdb0,(ulong)in_stack_fffffffffffffda8);
    peVar12 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b1040);
    peVar9 = std::
             __shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b1052);
    snapshot_sync_ctx::get_snapshot(peVar9);
    peVar10 = std::__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b106b);
    uVar13 = snapshot::get_last_log_idx(peVar10);
    peer::set_matched_idx(peVar12,uVar13);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffdb0);
    clear_snapshot_sync_ctx
              (in_stack_fffffffffffffe40,
               (peer *)CONCAT17(uVar16,CONCAT16(in_stack_fffffffffffffe3e,
                                                CONCAT15(in_stack_fffffffffffffe3d,
                                                         CONCAT14(bVar15,in_stack_fffffffffffffe38))
                                               )));
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar2) {
      peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b10e2);
      iVar4 = (**(code **)(*(long *)peVar7 + 0x38))();
      if (3 < iVar4) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b1115);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1b112e);
        uVar13 = peer::get_next_log_idx((peer *)0x1b1136);
        peVar12 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b1151);
        uVar14 = peer::get_matched_idx(peVar12);
        msg_if_given_abi_cxx11_
                  ((char *)local_120,
                   "snapshot has been copied and applied to new server, continue to sync logs after snapshot, next log idx %lu, matched idx %lu"
                   ,uVar13,uVar14);
        (**(code **)(*(long *)peVar7 + 0x40))
                  (peVar7,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_snapshot_sync.cxx"
                   ,"handle_install_snapshot_resp_new_member",0x1c1,local_120);
        std::__cxx11::string::~string(local_120);
      }
    }
  }
  std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1b1337
            );
  peer::get_next_log_idx((peer *)0x1b133f);
  sync_log_to_new_srv(in_stack_00000180,in_stack_00000178);
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x1b1367);
  local_ac = 0;
LAB_001b1372:
  std::shared_ptr<nuraft::snapshot_sync_ctx>::~shared_ptr
            ((shared_ptr<nuraft::snapshot_sync_ctx> *)0x1b137f);
  return;
}

Assistant:

void raft_server::handle_install_snapshot_resp_new_member(resp_msg& resp) {
    if (!srv_to_join_) {
        p_in("no server to join, the response must be very old.");
        return;
    }

    if (!resp.get_accepted()) {
        p_wn("peer doesn't accept the snapshot installation request, "
             "next log idx %" PRIu64 ", "
             "but we can move forward",
             resp.get_next_idx());
        srv_to_join_->set_next_log_idx(resp.get_next_idx());
    }
    srv_to_join_->reset_resp_timer();

    ptr<snapshot_sync_ctx> sync_ctx = srv_to_join_->get_snapshot_sync_ctx();
    if (sync_ctx == nullptr) {
        p_ft("SnapshotSyncContext must not be null: "
             "src %d dst %d my id %d leader id %d, "
             "maybe leader election happened in the meantime. "
             "next heartbeat or append request will cover it up.",
             resp.get_src(), resp.get_dst(), id_, leader_.load());
        return;
    }

    ptr<snapshot> snp = sync_ctx->get_snapshot();
    bool snp_install_done =
        ( snp->get_type() == snapshot::raw_binary &&
          resp.get_next_idx() >= snp->size() )         ||
        ( snp->get_type() == snapshot::logical_object &&
          resp.get_ctx() );

    if (snp_install_done) {
        // snapshot is done
        p_in("snapshot install is done\n");
        srv_to_join_->set_next_log_idx
            ( sync_ctx->get_snapshot()->get_last_log_idx() + 1 );
        srv_to_join_->set_matched_idx
            ( sync_ctx->get_snapshot()->get_last_log_idx() );

        clear_snapshot_sync_ctx(*srv_to_join_);

        p_in( "snapshot has been copied and applied to new server, "
              "continue to sync logs after snapshot, "
              "next log idx %" PRIu64 ", matched idx %" PRIu64 "",
              srv_to_join_->get_next_log_idx(),
              srv_to_join_->get_matched_idx() );
    } else {
        sync_ctx->set_offset(resp.get_next_idx());
        p_db( "continue to send snapshot to new server at offset %" PRIu64 "",
              resp.get_next_idx() );
    }

    sync_log_to_new_srv(srv_to_join_->get_next_log_idx());
}